

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_chaiscript::AST_Node_&(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_const_chaiscript::AST_Node_&(*)(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&)>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_chaiscript::AST_Node_&(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&),_const_chaiscript::AST_Node_&(*)(const_std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_&)>
           *this,_func_AST_Node_ptr_shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_ptr
                 *f)

{
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_61;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_60;
  Type_Info local_48;
  pointer_____offset_0x10___ *ppuStack_30;
  pointer_____offset_0x10___ *local_28;
  undefined8 uStack_20;
  
  local_28 = &Proxy_Function_Base::typeinfo;
  uStack_20 = 1;
  local_48.m_flags = 3;
  local_48._20_4_ = 0;
  ppuStack_30 = &std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>::typeinfo;
  local_48.m_type_info = (type_info *)&AST_Node::typeinfo;
  local_48.m_bare_type_info = (type_info *)&AST_Node::typeinfo;
  __l._M_len = 2;
  __l._M_array = &local_48;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_60,__l,&local_61);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_60);
  if (local_60.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_003d2118;
  this->m_f = f;
  return;
}

Assistant:

explicit Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr)))
          , m_f(std::move(f)) {
      }